

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

int Gia_QbfAddCofactor(Qbf_Man_t *p,Gia_Man_t *pCof)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  int iFirstVar;
  int useold;
  int i;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pCof_local;
  Qbf_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pCof,8,0,1,0,0);
  iVar3 = p_00->nVars;
  iVar1 = Gia_ManPiNum(pCof);
  iVar3 = iVar3 - iVar1;
  p_00->pMan = (Aig_Man_t *)0x0;
  iVar1 = sat_solver_nvars(p->pSatSyn);
  iVar2 = Gia_ManPiNum(p->pGia);
  Cnf_SpecialDataLift(p_00,iVar1,iVar3,iVar3 + iVar2);
  iFirstVar = 0;
  while( true ) {
    if (p_00->nClauses <= iFirstVar) {
      Cnf_DataFree(p_00);
      return 1;
    }
    iVar3 = sat_solver_addclause(p->pSatSyn,p_00->pClauses[iFirstVar],p_00->pClauses[iFirstVar + 1])
    ;
    if (iVar3 == 0) break;
    iFirstVar = iFirstVar + 1;
  }
  Cnf_DataFree(p_00);
  return 0;
}

Assistant:

int Gia_QbfAddCofactor( Qbf_Man_t * p, Gia_Man_t * pCof )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pCof, 8, 0, 1, 0, 0 );
    int i, useold = 0;
    int iFirstVar = useold ? sat_solver_nvars(p->pSatSyn) + pCnf->nVars - Gia_ManPiNum(pCof) : pCnf->nVars - Gia_ManPiNum(pCof); //-1   
    pCnf->pMan = NULL;
    
    if (useold)    
        Cnf_DataLift( pCnf, sat_solver_nvars(p->pSatSyn) );
    else
        Cnf_SpecialDataLift( pCnf, sat_solver_nvars(p->pSatSyn), iFirstVar, iFirstVar + Gia_ManPiNum(p->pGia) );

    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSatSyn, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            return 0;
        }
    Cnf_DataFree( pCnf );
    // add connection clauses
    if (useold)
           for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
            if ( !sat_solver_add_buffer( p->pSatSyn, i, iFirstVar+i, 0 ) )
                return 0;
    return 1;
}